

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall pybind11::dict::dict(dict *this)

{
  _object *ptr;
  handle local_18;
  dict *local_10;
  dict *this_local;
  
  local_10 = this;
  ptr = (_object *)PyDict_New();
  handle::handle<_object_*,_0>(&local_18,ptr);
  object::object(&this->super_object,local_18.m_ptr);
  if ((this->super_object).super_handle.m_ptr == (PyObject *)0x0) {
    pybind11_fail("Could not allocate dict object!");
  }
  return;
}

Assistant:

dict() : object(PyDict_New(), stolen_t{}) {
        if (!m_ptr) {
            pybind11_fail("Could not allocate dict object!");
        }
    }